

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

void __thiscall
diligent_spirv_cross::
SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::insert
          (SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *this,
          TypedID<(diligent_spirv_cross::Types)0> *itr,
          TypedID<(diligent_spirv_cross::Types)0> *insert_begin,
          TypedID<(diligent_spirv_cross::Types)0> *insert_end)

{
  TypedID<(diligent_spirv_cross::Types)0> *pTVar1;
  ulong uVar2;
  AlignedBuffer<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *pAVar3;
  long lVar4;
  ulong uVar5;
  TypedID<(diligent_spirv_cross::Types)0> *pTVar6;
  size_t __n;
  TypedID<(diligent_spirv_cross::Types)0> *pTVar7;
  ulong uVar8;
  long lVar9;
  AlignedBuffer<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *pAVar10;
  size_t sVar11;
  TypedID<(diligent_spirv_cross::Types)0> *__ptr;
  
  lVar9 = (long)insert_end - (long)insert_begin;
  uVar8 = lVar9 >> 2;
  __ptr = (this->super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>).
          ptr;
  sVar11 = (this->super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>).
           buffer_size;
  pTVar1 = __ptr + sVar11;
  uVar5 = sVar11 + uVar8;
  if ((long)pTVar1 - (long)itr == 0) {
    reserve(this,uVar5);
    sVar11 = (this->super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
             ).buffer_size;
    pTVar1 = (this->super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
             ).ptr;
    for (uVar5 = 0; uVar8 != uVar5; uVar5 = uVar5 + 1) {
      pTVar1[sVar11 + uVar5].id = insert_begin[uVar5].id;
    }
  }
  else if (this->buffer_capacity < uVar5) {
    uVar2 = 8;
    if (8 < uVar5) {
      uVar2 = uVar5;
    }
    do {
      uVar5 = uVar2;
      uVar2 = uVar5 * 2;
    } while (uVar5 < uVar8);
    if (uVar5 < 9) {
      pAVar3 = &this->stack_storage;
    }
    else {
      pAVar3 = (AlignedBuffer<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *)
               malloc(uVar5 * 4);
      if (pAVar3 == (AlignedBuffer<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>
                     *)0x0) {
        ::std::terminate();
      }
    }
    pTVar6 = __ptr;
    pTVar7 = insert_begin;
    pAVar10 = pAVar3;
    if (pAVar3 != (AlignedBuffer<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>
                   *)__ptr) {
      for (; pTVar6 != itr; pTVar6 = pTVar6 + 1) {
        *(uint32_t *)pAVar10->aligned_char = pTVar6->id;
        pAVar10 = (AlignedBuffer<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>
                   *)((long)pAVar10->aligned_char + 4);
      }
    }
    for (; pTVar7 != insert_end; pTVar7 = pTVar7 + 1) {
      *(uint32_t *)pAVar10->aligned_char = pTVar7->id;
      pAVar10 = (AlignedBuffer<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *
                )((long)pAVar10->aligned_char + 4);
    }
    if ((insert_begin != insert_end) ||
       (pAVar3 != (AlignedBuffer<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>
                   *)__ptr)) {
      for (lVar9 = 0;
          pTVar7 = (TypedID<(diligent_spirv_cross::Types)0> *)((long)&pTVar6->id + lVar9),
          pTVar7 != pTVar1; lVar9 = lVar9 + 4) {
        *(uint32_t *)((long)pAVar10->aligned_char + lVar9) = pTVar7->id;
      }
    }
    if ((AlignedBuffer<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *)__ptr
        != &this->stack_storage) {
      free(__ptr);
      sVar11 = (this->
               super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>).
               buffer_size;
    }
    (this->super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>).ptr =
         (TypedID<(diligent_spirv_cross::Types)0> *)pAVar3;
    this->buffer_capacity = uVar5;
  }
  else {
    for (lVar4 = 0;
        (pTVar6 = (TypedID<(diligent_spirv_cross::Types)0> *)((long)&pTVar1->id + lVar4),
        (long)insert_begin - (long)insert_end != lVar4 && (pTVar6 != itr)); lVar4 = lVar4 + -4) {
      *(undefined4 *)((long)pTVar1 + lVar4 + lVar9 + -4) =
           *(undefined4 *)((long)&pTVar1[-1].id + lVar4);
    }
    if (pTVar6 != itr) {
      __n = ((long)pTVar1 - (long)itr) + lVar4;
      memmove((void *)((long)pTVar1 + lVar4 + (lVar9 - __n)),itr,__n);
      __ptr = (this->
              super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>).ptr;
      sVar11 = (this->
               super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>).
               buffer_size;
    }
    for (; (itr != __ptr + sVar11 && (insert_begin != insert_end)); insert_begin = insert_begin + 1)
    {
      itr->id = insert_begin->id;
      itr = itr + 1;
    }
    for (lVar9 = 0;
        pTVar1 = (TypedID<(diligent_spirv_cross::Types)0> *)((long)&insert_begin->id + lVar9),
        pTVar1 != insert_end; lVar9 = lVar9 + 4) {
      *(uint32_t *)((long)&itr->id + lVar9) = pTVar1->id;
    }
  }
  (this->super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>).
  buffer_size = sVar11 + uVar8;
  return;
}

Assistant:

void insert(T *itr, const T *insert_begin, const T *insert_end) SPIRV_CROSS_NOEXCEPT
	{
		auto count = size_t(insert_end - insert_begin);
		if (itr == this->end())
		{
			reserve(this->buffer_size + count);
			for (size_t i = 0; i < count; i++, insert_begin++)
				new (&this->ptr[this->buffer_size + i]) T(*insert_begin);
			this->buffer_size += count;
		}
		else
		{
			if (this->buffer_size + count > buffer_capacity)
			{
				auto target_capacity = this->buffer_size + count;
				if (target_capacity == 0)
					target_capacity = 1;
				if (target_capacity < N)
					target_capacity = N;

				while (target_capacity < count)
					target_capacity <<= 1u;

				// Need to allocate new buffer. Move everything to a new buffer.
				T *new_buffer =
				    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

				// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
				if (!new_buffer)
					std::terminate();

				// First, move elements from source buffer to new buffer.
				// We don't deal with types which can throw in move constructor.
				auto *target_itr = new_buffer;
				auto *original_source_itr = this->begin();

				if (new_buffer != this->ptr)
				{
					while (original_source_itr != itr)
					{
						new (target_itr) T(std::move(*original_source_itr));
						original_source_itr->~T();
						++original_source_itr;
						++target_itr;
					}
				}

				// Copy-construct new elements.
				for (auto *source_itr = insert_begin; source_itr != insert_end; ++source_itr, ++target_itr)
					new (target_itr) T(*source_itr);

				// Move over the other half.
				if (new_buffer != this->ptr || insert_begin != insert_end)
				{
					while (original_source_itr != this->end())
					{
						new (target_itr) T(std::move(*original_source_itr));
						original_source_itr->~T();
						++original_source_itr;
						++target_itr;
					}
				}

				if (this->ptr != stack_storage.data())
					free(this->ptr);
				this->ptr = new_buffer;
				buffer_capacity = target_capacity;
			}
			else
			{
				// Move in place, need to be a bit careful about which elements are constructed and which are not.
				// Move the end and construct the new elements.
				auto *target_itr = this->end() + count;
				auto *source_itr = this->end();
				while (target_itr != this->end() && source_itr != itr)
				{
					--target_itr;
					--source_itr;
					new (target_itr) T(std::move(*source_itr));
				}

				// For already constructed elements we can move-assign.
				std::move_backward(itr, source_itr, target_itr);

				// For the inserts which go to already constructed elements, we can do a plain copy.
				while (itr != this->end() && insert_begin != insert_end)
					*itr++ = *insert_begin++;

				// For inserts into newly allocated memory, we must copy-construct instead.
				while (insert_begin != insert_end)
				{
					new (itr) T(*insert_begin);
					++itr;
					++insert_begin;
				}
			}

			this->buffer_size += count;
		}
	}